

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexCare.c
# Opt level: O3

Abc_Cex_t * Bmc_CexCareTotal(Abc_Cex_t **pCexes,int nCexes)

{
  Abc_Cex_t *pAVar1;
  int iVar2;
  Abc_Cex_t *pAVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  
  pAVar1 = *pCexes;
  uVar4 = pAVar1->nBits;
  iVar8 = (int)uVar4 >> 5;
  pAVar3 = Abc_CexAlloc(pAVar1->nRegs,pAVar1->nPis,pAVar1->iFrame + 1);
  pAVar1 = *pCexes;
  iVar2 = pAVar1->iFrame;
  pAVar3->iPo = pAVar1->iPo;
  pAVar3->iFrame = iVar2;
  uVar6 = (uint)((uVar4 & 0x1f) != 0);
  uVar4 = uVar6 + iVar8;
  if (uVar4 != 0 && SCARRY4(uVar6,iVar8) == (int)uVar4 < 0) {
    uVar5 = 0;
    do {
      uVar6 = (&pAVar1[1].iPo)[uVar5];
      (&pAVar3[1].iPo)[uVar5] = uVar6;
      if (1 < nCexes) {
        uVar7 = 1;
        do {
          uVar6 = uVar6 & (&pCexes[uVar7][1].iPo)[uVar5];
          (&pAVar3[1].iPo)[uVar5] = uVar6;
          uVar7 = uVar7 + 1;
        } while ((uint)nCexes != uVar7);
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 != uVar4);
  }
  return pAVar3;
}

Assistant:

Abc_Cex_t * Bmc_CexCareTotal( Abc_Cex_t ** pCexes, int nCexes )
{
    int i, k, nWords = Abc_BitWordNum( pCexes[0]->nBits );
    Abc_Cex_t * pCexMin = Abc_CexAlloc( pCexes[0]->nRegs, pCexes[0]->nPis, pCexes[0]->iFrame + 1 );
    pCexMin->iPo    = pCexes[0]->iPo;
    pCexMin->iFrame = pCexes[0]->iFrame;
    for ( i = 0; i < nWords; i++ )
    {
        pCexMin->pData[i] = pCexes[0]->pData[i];
        for ( k = 1; k < nCexes; k++ )
            pCexMin->pData[i] &= pCexes[k]->pData[i];
    }
    return pCexMin;
}